

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_fsh_texture_colorfilter(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform lowp mat4 CM; varying highp vec2 vT; void main() { gl_FragColor = CM * texture2D(t, vT); }"
  ;
}

Assistant:

inline const char *openglrenderer_fsh_texture_colorfilter() { return RENGINE_GLSL(
    uniform lowp sampler2D t;
    uniform lowp mat4 CM;
    varying highp vec2 vT;
    void main() {
        gl_FragColor = CM * texture2D(t, vT);
    }
); }